

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBools::_internal_add_values
          (TensorValue_RepeatedBools *this,bool value)

{
  RepeatedField<bool> *this_00;
  uint uVar1;
  bool *pbVar2;
  bool tmp;
  
  this_00 = &this->values_;
  uVar1 = (this->values_).current_size_;
  if (uVar1 == (this->values_).total_size_) {
    google::protobuf::RepeatedField<bool>::Reserve(this_00,uVar1 + 1);
    pbVar2 = google::protobuf::RepeatedField<bool>::elements(this_00);
    pbVar2[uVar1] = value;
  }
  else {
    pbVar2 = google::protobuf::RepeatedField<bool>::elements(this_00);
    pbVar2[uVar1] = value;
  }
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void TensorValue_RepeatedBools::_internal_add_values(bool value) {
  values_.Add(value);
}